

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Atom.cpp
# Opt level: O0

void __thiscall mbc::Val::_ValAtom::_ValAtom(_ValAtom *this)

{
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  anon_class_1_0_00000001 local_1d [13];
  _ValAtom *local_10;
  _ValAtom *this_local;
  
  local_10 = this;
  ValBase::ValBase(&this->super_ValBase);
  (this->super_ValBase)._vptr_ValBase = (_func_int **)&PTR___ValAtom_00192640;
  this_00 = (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)operator_new(0x20);
  std::function<bool(std::__cxx11::string_const&)>::
  function<mbc::Val::_ValAtom::_ValAtom()::__0,void>
            ((function<bool(std::__cxx11::string_const&)> *)this_00,local_1d);
  this->vaild_checker_ = this_00;
  *(this->super_ValBase).type_ = ATOM;
  return;
}

Assistant:

_ValAtom::_ValAtom() : ValBase() {
    vaild_checker_ = new std::function<bool(const string& str)>(
                            [](const string& str){return true;}
                     );
    *type_ = Type(ATOM);
}